

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O0

ThreeAxisAngularAccelerometerSensor * __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::operator=
          (ThreeAxisAngularAccelerometerSensor *this,ThreeAxisAngularAccelerometerSensor *other)

{
  ThreeAxisAngularAccelerometerPrivateAttributes *in_RSI;
  ThreeAxisAngularAccelerometerPrivateAttributes *in_RDI;
  
  if (in_RDI != in_RSI) {
    ThreeAxisAngularAccelerometerPrivateAttributes::operator=(in_RSI,in_RDI);
  }
  return (ThreeAxisAngularAccelerometerSensor *)in_RDI;
}

Assistant:

ThreeAxisAngularAccelerometerSensor& ThreeAxisAngularAccelerometerSensor::operator=(const ThreeAxisAngularAccelerometerSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}